

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

void Common::refactor(TaskHandle *head)

{
  bool bVar1;
  TaskHandle task;
  TaskHandle tail;
  TaskHandle loop_head;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._M_ptr = (Task *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_68,&local_38);
  while (local_68._M_ptr != (Task *)0x0) {
    bVar1 = Task::isDealloc(local_68._M_ptr);
    if (!bVar1) {
      bVar1 = Task::isShare(local_68._M_ptr);
      if (!bVar1) {
        if (local_48._M_ptr == (element_type *)0x0) {
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,&local_68);
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_48,&head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
          local_58._M_ptr = (element_type *)0x0;
          local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((local_68._M_ptr)->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_58);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
        }
        else {
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((local_48._M_ptr)->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_68);
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((local_68._M_ptr)->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_48);
          std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_48,&local_68);
        }
      }
    }
    std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_68,
               &((local_68._M_ptr)->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_48._M_ptr)->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>,
             &local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

static void refactor(TaskHandle &head) {
        TaskHandle loop_head = head, tail;
        head = nullptr;
        LOOP(task, loop_head) {
            if (not (task->isDealloc() or task->isShare())) {
                if (not tail) {
                    tail = head = task;
                    task->prev = nullptr;
                } else {
                    tail->next = task;
                    task->prev = tail;
                    tail = task;
                }
            }
        }
        tail->next = nullptr;
    }